

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void __thiscall
google::protobuf::TestUtil::ReflectionTester::SetAllFieldsViaReflection
          (ReflectionTester *this,Message *message)

{
  Message *pMVar1;
  Reflection *this_00;
  FieldDescriptor *pFVar2;
  Reflection *pRVar3;
  allocator<char> local_1319;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  allocator<char> local_12c9;
  string local_12c8;
  allocator<char> local_12a1;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  allocator<char> local_1111;
  string local_1110;
  allocator<char> local_10e9;
  string local_10e8;
  allocator<char> local_10c1;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  allocator<char> local_1071;
  string local_1070;
  allocator<char> local_1049;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  allocator<char> local_e41;
  string local_e40;
  allocator<char> local_e19;
  string local_e18;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  allocator<char> local_bc1;
  string local_bc0;
  allocator<char> local_b99;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Message *local_28;
  Message *sub_message;
  Reflection *reflection;
  Message *message_local;
  ReflectionTester *this_local;
  
  reflection = (Reflection *)message;
  message_local = (Message *)this;
  this_00 = Message::GetReflection(message);
  pRVar3 = reflection;
  sub_message = (Message *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"optional_int32",&local_49)
  ;
  pFVar2 = F(this,&local_48);
  Reflection::SetInt32(this_00,(Message *)pRVar3,pFVar2,0x65);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"optional_int64",&local_81)
  ;
  pFVar2 = F(this,&local_80);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x66);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"optional_uint32",&local_a9);
  pFVar2 = F(this,&local_a8);
  Reflection::SetUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x67);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"optional_uint64",&local_d1);
  pFVar2 = F(this,&local_d0);
  Reflection::SetUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x68);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"optional_sint32",&local_f9);
  pFVar2 = F(this,&local_f8);
  Reflection::SetInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x69);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"optional_sint64",&local_121);
  pFVar2 = F(this,&local_120);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x6a);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"optional_fixed32",&local_149);
  pFVar2 = F(this,&local_148);
  Reflection::SetUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x6b);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"optional_fixed64",&local_171);
  pFVar2 = F(this,&local_170);
  Reflection::SetUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x6c);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"optional_sfixed32",&local_199);
  pFVar2 = F(this,&local_198);
  Reflection::SetInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x6d);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"optional_sfixed64",&local_1c1);
  pFVar2 = F(this,&local_1c0);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x6e);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"optional_float",&local_1e9);
  pFVar2 = F(this,&local_1e8);
  Reflection::SetFloat((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,111.0);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"optional_double",&local_211);
  pFVar2 = F(this,&local_210);
  Reflection::SetDouble((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,112.0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"optional_bool",&local_239);
  pFVar2 = F(this,&local_238);
  Reflection::SetBool((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,true);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"optional_string",&local_261);
  pFVar2 = F(this,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"115",&local_289);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"optional_bytes",&local_2b1);
  pFVar2 = F(this,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"116",&local_2d9);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"optionalgroup",&local_301);
  pFVar2 = F(this,&local_300);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->group_a_,0x75);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"optional_nested_message",&local_329);
  pFVar2 = F(this,&local_328);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x76);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"optional_foreign_message",&local_351);
  pFVar2 = F(this,&local_350);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->foreign_c_,0x77);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"optional_import_message",&local_379);
  pFVar2 = F(this,&local_378);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->import_d_,0x78);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"optional_nested_enum",&local_3a1);
  pFVar2 = F(this,&local_3a0);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->nested_baz_);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"optional_foreign_enum",&local_3c9);
  pFVar2 = F(this,&local_3c8);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->foreign_baz_);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"optional_import_enum",&local_3f1);
  pFVar2 = F(this,&local_3f0);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->import_baz_);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"optional_string_piece",&local_419);
  pFVar2 = F(this,&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"124",&local_441);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"optional_cord",&local_469);
  pFVar2 = F(this,&local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"125",&local_491);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"optional_bytes_cord",&local_4b9);
  pFVar2 = F(this,&local_4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"optional bytes cord",&local_4e1);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"optional_public_import_message",&local_509);
  pFVar2 = F(this,&local_508);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->import_e_,0x7e);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"optional_lazy_message",&local_531);
  pFVar2 = F(this,&local_530);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x7f);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"optional_unverified_lazy_message",&local_559);
  pFVar2 = F(this,&local_558);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x80);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"repeated_int32",&local_581);
  pFVar2 = F(this,&local_580);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xc9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"repeated_int64",&local_5a9);
  pFVar2 = F(this,&local_5a8);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xca);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"repeated_uint32",&local_5d1);
  pFVar2 = F(this,&local_5d0);
  Reflection::AddUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xcb);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"repeated_uint64",&local_5f9);
  pFVar2 = F(this,&local_5f8);
  Reflection::AddUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xcc);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"repeated_sint32",&local_621);
  pFVar2 = F(this,&local_620);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xcd);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"repeated_sint64",&local_649);
  pFVar2 = F(this,&local_648);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xce);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"repeated_fixed32",&local_671);
  pFVar2 = F(this,&local_670);
  Reflection::AddUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xcf);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"repeated_fixed64",&local_699);
  pFVar2 = F(this,&local_698);
  Reflection::AddUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xd0);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"repeated_sfixed32",&local_6c1);
  pFVar2 = F(this,&local_6c0);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xd1);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"repeated_sfixed64",&local_6e9);
  pFVar2 = F(this,&local_6e8);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0xd2);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"repeated_float",&local_711);
  pFVar2 = F(this,&local_710);
  Reflection::AddFloat((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,211.0);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"repeated_double",&local_739);
  pFVar2 = F(this,&local_738);
  Reflection::AddDouble((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,212.0);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"repeated_bool",&local_761);
  pFVar2 = F(this,&local_760);
  Reflection::AddBool((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,true);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"repeated_string",&local_789);
  pFVar2 = F(this,&local_788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"215",&local_7b1);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"repeated_bytes",&local_7d9);
  pFVar2 = F(this,&local_7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"216",&local_801);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"repeatedgroup",&local_829);
  pFVar2 = F(this,&local_828);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->repeated_group_a_,0xd9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"repeated_nested_message",&local_851);
  pFVar2 = F(this,&local_850);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0xda);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"repeated_foreign_message",&local_879);
  pFVar2 = F(this,&local_878);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator(&local_879);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->foreign_c_,0xdb);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"repeated_import_message",&local_8a1);
  pFVar2 = F(this,&local_8a0);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->import_d_,0xdc);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"repeated_lazy_message",&local_8c9);
  pFVar2 = F(this,&local_8c8);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0xe3);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"repeated_nested_enum",&local_8f1);
  pFVar2 = F(this,&local_8f0);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->nested_bar_);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"repeated_foreign_enum",&local_919);
  pFVar2 = F(this,&local_918);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->foreign_bar_);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"repeated_import_enum",&local_941);
  pFVar2 = F(this,&local_940);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->import_bar_);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"repeated_string_piece",&local_969);
  pFVar2 = F(this,&local_968);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"224",&local_991);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"repeated_cord",&local_9b9);
  pFVar2 = F(this,&local_9b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"225",&local_9e1);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"repeated_int32",&local_a09);
  pFVar2 = F(this,&local_a08);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x12d);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,"repeated_int64",&local_a31);
  pFVar2 = F(this,&local_a30);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x12e);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a58,"repeated_uint32",&local_a59);
  pFVar2 = F(this,&local_a58);
  Reflection::AddUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x12f);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator(&local_a59);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"repeated_uint64",&local_a81);
  pFVar2 = F(this,&local_a80);
  Reflection::AddUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x130);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"repeated_sint32",&local_aa9);
  pFVar2 = F(this,&local_aa8);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x131);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator(&local_aa9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad0,"repeated_sint64",&local_ad1);
  pFVar2 = F(this,&local_ad0);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x132);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator(&local_ad1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"repeated_fixed32",&local_af9);
  pFVar2 = F(this,&local_af8);
  Reflection::AddUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x133);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20,"repeated_fixed64",&local_b21);
  pFVar2 = F(this,&local_b20);
  Reflection::AddUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x134);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator(&local_b21);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b48,"repeated_sfixed32",&local_b49);
  pFVar2 = F(this,&local_b48);
  Reflection::AddInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x135);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b70,"repeated_sfixed64",&local_b71);
  pFVar2 = F(this,&local_b70);
  Reflection::AddInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x136);
  std::__cxx11::string::~string((string *)&local_b70);
  std::allocator<char>::~allocator(&local_b71);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b98,"repeated_float",&local_b99);
  pFVar2 = F(this,&local_b98);
  Reflection::AddFloat((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,311.0);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc0,"repeated_double",&local_bc1);
  pFVar2 = F(this,&local_bc0);
  Reflection::AddDouble((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,312.0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::allocator<char>::~allocator(&local_bc1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"repeated_bool",&local_be9);
  pFVar2 = F(this,&local_be8);
  Reflection::AddBool((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,false);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c10,"repeated_string",&local_c11);
  pFVar2 = F(this,&local_c10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"315",&local_c39);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_c38);
  std::__cxx11::string::~string((string *)&local_c38);
  std::allocator<char>::~allocator(&local_c39);
  std::__cxx11::string::~string((string *)&local_c10);
  std::allocator<char>::~allocator(&local_c11);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c60,"repeated_bytes",&local_c61);
  pFVar2 = F(this,&local_c60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"316",&local_c89);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_c88);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator(&local_c89);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator(&local_c61);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,"repeatedgroup",&local_cb1);
  pFVar2 = F(this,&local_cb0);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->repeated_group_a_,0x13d);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"repeated_nested_message",&local_cd9);
  pFVar2 = F(this,&local_cd8);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x13e);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d00,"repeated_foreign_message",&local_d01);
  pFVar2 = F(this,&local_d00);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator(&local_d01);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->foreign_c_,0x13f);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d28,"repeated_import_message",&local_d29);
  pFVar2 = F(this,&local_d28);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->import_d_,0x140);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"repeated_lazy_message",&local_d51);
  pFVar2 = F(this,&local_d50);
  local_28 = Reflection::AddMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x147);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d78,"repeated_nested_enum",&local_d79);
  pFVar2 = F(this,&local_d78);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->nested_baz_);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da0,"repeated_foreign_enum",&local_da1);
  pFVar2 = F(this,&local_da0);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->foreign_baz_);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator(&local_da1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"repeated_import_enum",&local_dc9);
  pFVar2 = F(this,&local_dc8);
  Reflection::AddEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->import_baz_);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df0,"repeated_string_piece",&local_df1);
  pFVar2 = F(this,&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e18,"324",&local_e19);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_e18);
  std::__cxx11::string::~string((string *)&local_e18);
  std::allocator<char>::~allocator(&local_e19);
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e40,"repeated_cord",&local_e41);
  pFVar2 = F(this,&local_e40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"325",&local_e69);
  Reflection::AddString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_e68);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  std::__cxx11::string::~string((string *)&local_e40);
  std::allocator<char>::~allocator(&local_e41);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e90,"default_int32",&local_e91);
  pFVar2 = F(this,&local_e90);
  Reflection::SetInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x191);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator(&local_e91);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"default_int64",&local_eb9);
  pFVar2 = F(this,&local_eb8);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x192);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"default_uint32",&local_ee1);
  pFVar2 = F(this,&local_ee0);
  Reflection::SetUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x193);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f08,"default_uint64",&local_f09);
  pFVar2 = F(this,&local_f08);
  Reflection::SetUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x194);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f30,"default_sint32",&local_f31);
  pFVar2 = F(this,&local_f30);
  Reflection::SetInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x195);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f58,"default_sint64",&local_f59);
  pFVar2 = F(this,&local_f58);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x196);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator(&local_f59);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"default_fixed32",&local_f81);
  pFVar2 = F(this,&local_f80);
  Reflection::SetUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x197);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator(&local_f81);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"default_fixed64",&local_fa9);
  pFVar2 = F(this,&local_fa8);
  Reflection::SetUInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x198);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd0,"default_sfixed32",&local_fd1);
  pFVar2 = F(this,&local_fd0);
  Reflection::SetInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x199);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator(&local_fd1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff8,"default_sfixed64",&local_ff9);
  pFVar2 = F(this,&local_ff8);
  Reflection::SetInt64((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x19a);
  std::__cxx11::string::~string((string *)&local_ff8);
  std::allocator<char>::~allocator(&local_ff9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"default_float",&local_1021);
  pFVar2 = F(this,&local_1020);
  Reflection::SetFloat((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,411.0);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1048,"default_double",&local_1049);
  pFVar2 = F(this,&local_1048);
  Reflection::SetDouble((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,412.0);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator(&local_1049);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1070,"default_bool",&local_1071);
  pFVar2 = F(this,&local_1070);
  Reflection::SetBool((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,false);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1098,"default_string",&local_1099);
  pFVar2 = F(this,&local_1098);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c0,"415",&local_10c1);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_10c0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  std::__cxx11::string::~string((string *)&local_1098);
  std::allocator<char>::~allocator(&local_1099);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10e8,"default_bytes",&local_10e9);
  pFVar2 = F(this,&local_10e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1110,"416",&local_1111);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator(&local_10e9);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1138,"default_nested_enum",&local_1139);
  pFVar2 = F(this,&local_1138);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->nested_foo_);
  std::__cxx11::string::~string((string *)&local_1138);
  std::allocator<char>::~allocator(&local_1139);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,"default_foreign_enum",&local_1161);
  pFVar2 = F(this,&local_1160);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->foreign_foo_);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1188,"default_import_enum",&local_1189);
  pFVar2 = F(this,&local_1188);
  Reflection::SetEnum((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,this->import_foo_);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11b0,"default_string_piece",&local_11b1);
  pFVar2 = F(this,&local_11b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11d8,"424",&local_11d9);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_11d8);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::allocator<char>::~allocator(&local_11d9);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::allocator<char>::~allocator(&local_11b1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"default_cord",&local_1201);
  pFVar2 = F(this,&local_1200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1228,"425",&local_1229);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1250,"oneof_uint32",&local_1251);
  pFVar2 = F(this,&local_1250);
  Reflection::SetUInt32((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,0x259);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1278,"oneof_nested_message",&local_1279);
  pFVar2 = F(this,&local_1278);
  local_28 = Reflection::MutableMessage
                       ((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  pRVar3 = Message::GetReflection(local_28);
  Reflection::SetInt32(pRVar3,local_28,this->nested_b_,0x25a);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12a0,"oneof_string",&local_12a1);
  pFVar2 = F(this,&local_12a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c8,"603",&local_12c9);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_12c8);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::allocator<char>::~allocator(&local_12c9);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator(&local_12a1);
  pRVar3 = reflection;
  pMVar1 = sub_message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f0,"oneof_bytes",&local_12f1);
  pFVar2 = F(this,&local_12f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1318,"604",&local_1319);
  Reflection::SetString((Reflection *)pMVar1,(Message *)pRVar3,pFVar2,&local_1318);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator(&local_1319);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::SetAllFieldsViaReflection(
    Message* message) {
  const Reflection* reflection = message->GetReflection();
  Message* sub_message;

  reflection->SetInt32(message, F("optional_int32"), 101);
  reflection->SetInt64(message, F("optional_int64"), 102);
  reflection->SetUInt32(message, F("optional_uint32"), 103);
  reflection->SetUInt64(message, F("optional_uint64"), 104);
  reflection->SetInt32(message, F("optional_sint32"), 105);
  reflection->SetInt64(message, F("optional_sint64"), 106);
  reflection->SetUInt32(message, F("optional_fixed32"), 107);
  reflection->SetUInt64(message, F("optional_fixed64"), 108);
  reflection->SetInt32(message, F("optional_sfixed32"), 109);
  reflection->SetInt64(message, F("optional_sfixed64"), 110);
  reflection->SetFloat(message, F("optional_float"), 111);
  reflection->SetDouble(message, F("optional_double"), 112);
  reflection->SetBool(message, F("optional_bool"), true);
  reflection->SetString(message, F("optional_string"), "115");
  reflection->SetString(message, F("optional_bytes"), "116");

  sub_message = reflection->MutableMessage(message, F("optionalgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, group_a_, 117);
  sub_message =
      reflection->MutableMessage(message, F("optional_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 118);
  sub_message =
      reflection->MutableMessage(message, F("optional_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 119);
  sub_message =
      reflection->MutableMessage(message, F("optional_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 120);

  reflection->SetEnum(message, F("optional_nested_enum"), nested_baz_);
  reflection->SetEnum(message, F("optional_foreign_enum"), foreign_baz_);
  reflection->SetEnum(message, F("optional_import_enum"), import_baz_);

  reflection->SetString(message, F("optional_string_piece"), "124");
  reflection->SetString(message, F("optional_cord"), "125");
  reflection->SetString(message, F("optional_bytes_cord"),
                        "optional bytes cord");

  sub_message =
      reflection->MutableMessage(message, F("optional_public_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_e_, 126);

  sub_message = reflection->MutableMessage(message, F("optional_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 127);

  sub_message = reflection->MutableMessage(
      message, F("optional_unverified_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 128);

  // -----------------------------------------------------------------

  reflection->AddInt32(message, F("repeated_int32"), 201);
  reflection->AddInt64(message, F("repeated_int64"), 202);
  reflection->AddUInt32(message, F("repeated_uint32"), 203);
  reflection->AddUInt64(message, F("repeated_uint64"), 204);
  reflection->AddInt32(message, F("repeated_sint32"), 205);
  reflection->AddInt64(message, F("repeated_sint64"), 206);
  reflection->AddUInt32(message, F("repeated_fixed32"), 207);
  reflection->AddUInt64(message, F("repeated_fixed64"), 208);
  reflection->AddInt32(message, F("repeated_sfixed32"), 209);
  reflection->AddInt64(message, F("repeated_sfixed64"), 210);
  reflection->AddFloat(message, F("repeated_float"), 211);
  reflection->AddDouble(message, F("repeated_double"), 212);
  reflection->AddBool(message, F("repeated_bool"), true);
  reflection->AddString(message, F("repeated_string"), "215");
  reflection->AddString(message, F("repeated_bytes"), "216");

  sub_message = reflection->AddMessage(message, F("repeatedgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 217);
  sub_message = reflection->AddMessage(message, F("repeated_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 218);
  sub_message = reflection->AddMessage(message, F("repeated_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 219);
  sub_message = reflection->AddMessage(message, F("repeated_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 220);
  sub_message = reflection->AddMessage(message, F("repeated_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 227);

  reflection->AddEnum(message, F("repeated_nested_enum"), nested_bar_);
  reflection->AddEnum(message, F("repeated_foreign_enum"), foreign_bar_);
  reflection->AddEnum(message, F("repeated_import_enum"), import_bar_);

  reflection->AddString(message, F("repeated_string_piece"), "224");
  reflection->AddString(message, F("repeated_cord"), "225");

  // Add a second one of each field.
  reflection->AddInt32(message, F("repeated_int32"), 301);
  reflection->AddInt64(message, F("repeated_int64"), 302);
  reflection->AddUInt32(message, F("repeated_uint32"), 303);
  reflection->AddUInt64(message, F("repeated_uint64"), 304);
  reflection->AddInt32(message, F("repeated_sint32"), 305);
  reflection->AddInt64(message, F("repeated_sint64"), 306);
  reflection->AddUInt32(message, F("repeated_fixed32"), 307);
  reflection->AddUInt64(message, F("repeated_fixed64"), 308);
  reflection->AddInt32(message, F("repeated_sfixed32"), 309);
  reflection->AddInt64(message, F("repeated_sfixed64"), 310);
  reflection->AddFloat(message, F("repeated_float"), 311);
  reflection->AddDouble(message, F("repeated_double"), 312);
  reflection->AddBool(message, F("repeated_bool"), false);
  reflection->AddString(message, F("repeated_string"), "315");
  reflection->AddString(message, F("repeated_bytes"), "316");

  sub_message = reflection->AddMessage(message, F("repeatedgroup"));
  sub_message->GetReflection()->SetInt32(sub_message, repeated_group_a_, 317);
  sub_message = reflection->AddMessage(message, F("repeated_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 318);
  sub_message = reflection->AddMessage(message, F("repeated_foreign_message"));
  sub_message->GetReflection()->SetInt32(sub_message, foreign_c_, 319);
  sub_message = reflection->AddMessage(message, F("repeated_import_message"));
  sub_message->GetReflection()->SetInt32(sub_message, import_d_, 320);
  sub_message = reflection->AddMessage(message, F("repeated_lazy_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 327);

  reflection->AddEnum(message, F("repeated_nested_enum"), nested_baz_);
  reflection->AddEnum(message, F("repeated_foreign_enum"), foreign_baz_);
  reflection->AddEnum(message, F("repeated_import_enum"), import_baz_);

  reflection->AddString(message, F("repeated_string_piece"), "324");
  reflection->AddString(message, F("repeated_cord"), "325");

  // -----------------------------------------------------------------

  reflection->SetInt32(message, F("default_int32"), 401);
  reflection->SetInt64(message, F("default_int64"), 402);
  reflection->SetUInt32(message, F("default_uint32"), 403);
  reflection->SetUInt64(message, F("default_uint64"), 404);
  reflection->SetInt32(message, F("default_sint32"), 405);
  reflection->SetInt64(message, F("default_sint64"), 406);
  reflection->SetUInt32(message, F("default_fixed32"), 407);
  reflection->SetUInt64(message, F("default_fixed64"), 408);
  reflection->SetInt32(message, F("default_sfixed32"), 409);
  reflection->SetInt64(message, F("default_sfixed64"), 410);
  reflection->SetFloat(message, F("default_float"), 411);
  reflection->SetDouble(message, F("default_double"), 412);
  reflection->SetBool(message, F("default_bool"), false);
  reflection->SetString(message, F("default_string"), "415");
  reflection->SetString(message, F("default_bytes"), "416");

  reflection->SetEnum(message, F("default_nested_enum"), nested_foo_);
  reflection->SetEnum(message, F("default_foreign_enum"), foreign_foo_);
  reflection->SetEnum(message, F("default_import_enum"), import_foo_);

  reflection->SetString(message, F("default_string_piece"), "424");
  reflection->SetString(message, F("default_cord"), "425");

  reflection->SetUInt32(message, F("oneof_uint32"), 601);
  sub_message = reflection->MutableMessage(message, F("oneof_nested_message"));
  sub_message->GetReflection()->SetInt32(sub_message, nested_b_, 602);
  reflection->SetString(message, F("oneof_string"), "603");
  reflection->SetString(message, F("oneof_bytes"), "604");
}